

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

bool ImFontAtlasBuildWithStbTruetype(ImFontAtlas *atlas)

{
  stbrp_node *psVar1;
  stbrp_node *psVar2;
  undefined4 uVar3;
  undefined8 uVar4;
  stbtt__point sVar5;
  stbtt__point sVar6;
  undefined4 uVar7;
  stbtt_uint8 sVar8;
  byte bVar9;
  undefined4 uVar10;
  ImFontAtlas *pIVar11;
  undefined4 uVar15;
  int *piVar12;
  undefined8 *puVar13;
  ImFont *this;
  long lVar14;
  stbrp_node *psVar16;
  short sVar17;
  short sVar18;
  undefined1 auVar19 [15];
  undefined1 auVar20 [14];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [14];
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  undefined1 auVar28 [15];
  unkuint9 Var29;
  undefined1 auVar30 [11];
  undefined1 auVar31 [13];
  undefined1 auVar32 [14];
  unkbyte10 Var33;
  undefined1 auVar34 [12];
  undefined1 auVar35 [16];
  undefined1 auVar36 [15];
  undefined1 auVar37 [15];
  uint6 uVar38;
  ushort uVar39;
  stbtt_uint32 sVar40;
  stbtt__active_edge *z;
  stbtt_uint32 sVar41;
  stbtt_uint32 sVar42;
  stbtt_uint32 sVar43;
  stbtt_uint32 sVar44;
  stbtt_uint32 sVar45;
  value_type *pvVar46;
  stbrp_context *ptr;
  stbrp_node *psVar47;
  long lVar48;
  void *pvVar49;
  void *pvVar50;
  void *__s;
  uchar *puVar51;
  stbtt__point *psVar52;
  stbtt__edge *p_00;
  stbtt__edge *psVar53;
  stbtt__buf *scanline;
  undefined8 *puVar54;
  int *piVar55;
  long *plVar56;
  ImFontGlyph *pIVar57;
  ushort uVar58;
  uint uVar59;
  ImWchar *in_range;
  ImWchar *pIVar60;
  int *piVar61;
  stbtt__buf *psVar62;
  ulong uVar63;
  long lVar64;
  long lVar65;
  float *pfVar66;
  int input_i;
  int iVar67;
  ulong uVar68;
  size_t size;
  stbtt_uint32 encoding_record;
  int iVar69;
  uint uVar70;
  int iVar71;
  int iVar72;
  uchar *puVar73;
  int i;
  stbtt__edge *psVar74;
  ulong uVar75;
  uchar *puVar76;
  ulong uVar77;
  ulong uVar78;
  ulong uVar79;
  byte *pbVar80;
  ImVector<ImFontConfig> *this_00;
  int iVar81;
  uint uVar82;
  void *p;
  long lVar83;
  int *piVar84;
  uint uVar85;
  byte *pbVar86;
  ImWchar c;
  int iVar87;
  long lVar88;
  size_t size_00;
  stbtt__active_edge *e;
  ulong uVar89;
  stbtt_fontinfo *psVar90;
  short *psVar91;
  bool bVar92;
  byte bVar93;
  char cVar96;
  char cVar97;
  float sum;
  float fVar94;
  char cVar98;
  float fVar95;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  short sVar101;
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  float fVar102;
  undefined1 in_XMM2 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  float fVar106;
  undefined1 in_XMM3 [16];
  float fVar107;
  float fVar108;
  undefined1 auVar109 [16];
  float fVar110;
  float fVar111;
  float fVar112;
  undefined4 uVar113;
  undefined4 uVar114;
  float fVar115;
  stbtt__buf sVar116;
  stbtt_uint32 charstrings;
  float y0_2;
  undefined4 uStack_484;
  ImFontAtlas *local_480;
  undefined1 local_478 [16];
  stbtt__point *local_468;
  int x0_1;
  stbtt_uint32 fdarrayoff;
  undefined1 local_458 [16];
  undefined8 local_448;
  undefined4 uStack_440;
  undefined4 uStack_43c;
  float *local_430;
  undefined1 local_428 [16];
  stbtt_fontinfo *local_410;
  stbtt_uint32 cstype;
  undefined4 uStack_404;
  float local_3fc;
  stbrp_node *local_3f8;
  ulong local_3f0;
  undefined8 *local_3e8;
  int y0;
  ulong local_3d8;
  ImVector<ImFontConfig> *local_3d0;
  long local_3c8;
  undefined8 local_3c0;
  uint local_3b4;
  ulong local_3b0;
  uchar *local_3a8;
  stbtt_pack_context local_3a0;
  stbtt__point *local_368;
  ulong local_360;
  ulong local_358;
  long local_350;
  ulong local_348;
  long local_340;
  uint local_338;
  uint local_334;
  int local_330;
  int y0_1;
  undefined1 local_328 [16];
  void *local_318;
  void *local_310;
  long local_308;
  void *local_300;
  long local_2f8;
  long local_2f0;
  long local_2e8;
  long local_2e0;
  float local_2d8;
  undefined4 uStack_2d4;
  undefined4 uStack_2d0;
  undefined4 uStack_2cc;
  value_type *local_2c0;
  long local_2b8;
  long local_2b0;
  ulong local_2a8;
  stbtt__edge *local_2a0;
  ulong local_298;
  long local_290;
  size_t local_288;
  size_t local_280;
  uint *local_278;
  int local_270;
  int x1_1;
  ulong local_268;
  undefined8 uStack_260;
  undefined1 local_258 [16];
  undefined1 local_248 [16];
  stbtt__buf b;
  
  if ((atlas->ConfigData).Size < 1) {
    __assert_fail("atlas->ConfigData.Size > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui_draw.cpp"
                  ,0x69d,"bool ImFontAtlasBuildWithStbTruetype(ImFontAtlas *)");
  }
  local_3d0 = &atlas->ConfigData;
  ImFontAtlasBuildRegisterDefaultCustomRects(atlas);
  atlas->TexID = (ImTextureID)0x0;
  atlas->TexWidth = 0;
  atlas->TexHeight = 0;
  (atlas->TexUvScale).x = 0.0;
  (atlas->TexUvScale).y = 0.0;
  (atlas->TexUvWhitePixel).x = 0.0;
  (atlas->TexUvWhitePixel).y = 0.0;
  local_480 = atlas;
  ImFontAtlas::ClearTexData(atlas);
  iVar69 = 0;
  local_3f0 = 0;
  for (iVar67 = 0; iVar67 < local_3d0->Size; iVar67 = iVar67 + 1) {
    pvVar46 = ImVector<ImFontConfig>::operator[](local_3d0,iVar67);
    pIVar60 = pvVar46->GlyphRanges;
    if (pIVar60 == (ushort *)0x0) {
      pvVar46->GlyphRanges = ImFontAtlas::GetGlyphRangesDefault::ranges;
      pIVar60 = ImFontAtlas::GetGlyphRangesDefault::ranges;
    }
    for (; (*pIVar60 != 0 && (pIVar60[1] != 0)); pIVar60 = pIVar60 + 2) {
      local_3f0 = (ulong)(((int)local_3f0 - (uint)*pIVar60) + (uint)pIVar60[1] + 1);
      iVar69 = iVar69 + 1;
    }
  }
  local_430 = (float *)CONCAT44(local_430._4_4_,iVar69);
  iVar67 = local_480->TexDesiredWidth;
  if (iVar67 < 1) {
    iVar67 = 0x1000;
    iVar69 = (int)local_3f0;
    if ((iVar69 < 0xfa1) && (iVar67 = 0x800, iVar69 < 0x7d1)) {
      iVar67 = (uint)(1000 < iVar69) * 0x200 + 0x200;
    }
  }
  local_480->TexWidth = iVar67;
  local_480->TexHeight = 0;
  uVar70 = local_480->TexGlyphPadding;
  ptr = (stbrp_context *)ImGui::MemAlloc(0x48);
  iVar69 = iVar67 - uVar70;
  psVar47 = (stbrp_node *)ImGui::MemAlloc((long)iVar69 << 4);
  pIVar11 = local_480;
  if ((ptr == (stbrp_context *)0x0) || (psVar47 == (stbrp_node *)0x0)) {
    if (ptr != (stbrp_context *)0x0) {
      ImGui::MemFree(ptr);
    }
    if (psVar47 != (stbrp_node *)0x0) {
LAB_00175b8b:
      ImGui::MemFree(psVar47);
    }
    bVar92 = false;
  }
  else {
    local_3a0.user_allocator_context = (void *)0x0;
    local_3a0.height = 0x8000;
    local_3a0.pixels = (uchar *)0x0;
    local_3a0.pack_info = ptr;
    local_3a0.width = iVar67;
    local_3a0.stride_in_bytes = iVar67;
    local_3a0.padding = uVar70;
    local_3a0.nodes = psVar47;
    if (((int)uVar70 < -0x7fff) || (0xffff < iVar69)) {
      __assert_fail("width <= 0xffff && height <= 0xffff",
                    "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/stb_rect_pack.h"
                    ,0x100,"void stbrp_init_target(stbrp_context *, int, int, stbrp_node *, int)");
    }
    uVar82 = iVar69 - 1;
    uVar78 = 0;
    psVar16 = psVar47;
    uVar68 = uVar78;
    if (0 < (int)uVar82) {
      uVar78 = (ulong)uVar82;
      uVar68 = uVar78;
    }
    while( true ) {
      bVar92 = uVar78 == 0;
      uVar78 = uVar78 - 1;
      if (bVar92) break;
      psVar16->next = psVar16 + 1;
      psVar16 = psVar16 + 1;
    }
    psVar47[uVar68].next = (stbrp_node *)0x0;
    ptr->init_mode = 1;
    ptr->heuristic = 0;
    ptr->free_head = psVar47;
    ptr->active_head = ptr->extra;
    ptr->width = iVar69;
    ptr->height = 0x8000 - uVar70;
    ptr->num_nodes = iVar69;
    ptr->align = (int)(uVar82 + iVar69) / iVar69;
    ptr->extra[0].x = 0;
    ptr->extra[0].y = 0;
    ptr->extra[0].next = ptr->extra + 1;
    ptr->extra[1].x = (stbrp_coord)iVar69;
    ptr->extra[1].y = 0xffff;
    ptr->extra[1].next = (stbrp_node *)0x0;
    local_3a0.h_oversample = 1;
    local_3a0.v_oversample = 1;
    ImFontAtlasBuildPackCustomRects(local_480,ptr);
    local_3f8 = (stbrp_node *)ImGui::MemAlloc((long)(pIVar11->ConfigData).Size * 0xc0);
    lVar88 = 0;
    while (lVar88 < local_3d0->Size) {
      pvVar46 = ImVector<ImFontConfig>::operator[](local_3d0,(int)lVar88);
      if ((pvVar46->DstFont == (ImFont *)0x0) ||
         (pIVar11 = pvVar46->DstFont->ContainerAtlas,
         pIVar11 != local_480 && pIVar11 != (ImFontAtlas *)0x0)) {
        __assert_fail("cfg.DstFont && (!cfg.DstFont->IsLoaded() || cfg.DstFont->ContainerAtlas == atlas)"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui_draw.cpp"
                      ,0x6d0,"bool ImFontAtlasBuildWithStbTruetype(ImFontAtlas *)");
      }
      psVar47 = (stbrp_node *)pvVar46->FontData;
      iVar67 = pvVar46->FontNo;
      sVar8 = (stbtt_uint8)psVar47->x;
      if (sVar8 == '\0') {
        if (*(stbtt_uint8 *)((long)&psVar47->x + 1) != '\x01') goto LAB_00175b5a;
LAB_001756b9:
        if (((char)psVar47->y != '\0') || (*(char *)((long)&psVar47->y + 1) != '\0'))
        goto LAB_00175b5a;
LAB_001756cf:
        sVar45 = -(uint)(iVar67 != 0);
      }
      else {
        if (sVar8 != 't') {
          if (sVar8 != 'O') {
            if ((sVar8 != '1') || (*(stbtt_uint8 *)((long)&psVar47->x + 1) != '\0'))
            goto LAB_00175b5a;
            goto LAB_001756b9;
          }
          if (((*(stbtt_uint8 *)((long)&psVar47->x + 1) != 'T') || ((char)psVar47->y != 'T')) ||
             (*(char *)((long)&psVar47->y + 1) != 'O')) goto LAB_00175b5a;
          goto LAB_001756cf;
        }
        sVar8 = *(stbtt_uint8 *)((long)&psVar47->x + 1);
        if (sVar8 == 'r') {
          if (((char)psVar47->y != 'u') || (*(char *)((long)&psVar47->y + 1) != 'e'))
          goto LAB_00175b5a;
          goto LAB_001756cf;
        }
        if (sVar8 != 't') {
          if (((sVar8 != 'y') || ((char)psVar47->y != 'p')) ||
             (*(char *)((long)&psVar47->y + 1) != '1')) goto LAB_00175b5a;
          goto LAB_001756cf;
        }
        if ((((char)psVar47->y != 'c') || (*(char *)((long)&psVar47->y + 1) != 'f')) ||
           (((sVar45 = ttULONG(&psVar47->field_0x4), sVar45 != 0x20000 && (sVar45 != 0x10000)) ||
            (uVar70 = *(uint *)&psVar47->next,
            (int)(uVar70 >> 0x18 | (uVar70 & 0xff0000) >> 8 | (uVar70 & 0xff00) << 8 |
                 uVar70 << 0x18) <= iVar67)))) goto LAB_00175b5a;
        sVar45 = ttULONG((stbtt_uint8 *)((long)&psVar47->next + (long)iVar67 * 4 + 4));
      }
      psVar16 = local_3f8;
      if ((int)sVar45 < 0) {
LAB_00175b5a:
        __assert_fail("font_offset >= 0 && \"FontData is incorrect, or FontNo cannot be found.\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui_draw.cpp"
                      ,0x6d3,"bool ImFontAtlasBuildWithStbTruetype(ImFontAtlas *)");
      }
      local_458._0_8_ = lVar88;
      local_3f8[lVar88 * 0xc].next = psVar47;
      local_3f8[lVar88 * 0xc + 1].x = (short)sVar45;
      local_3f8[lVar88 * 0xc + 1].y = (short)(sVar45 >> 0x10);
      psVar1 = local_3f8 + lVar88 * 0xc + 4;
      psVar1->x = 0;
      psVar1->y = 0;
      *(undefined4 *)&psVar1->field_0x4 = 0;
      local_3f8[lVar88 * 0xc + 4].next = (stbrp_node *)0x0;
      sVar40 = stbtt__find_table((stbtt_uint8 *)psVar47,sVar45,"cmap");
      sVar41 = stbtt__find_table((stbtt_uint8 *)psVar47,sVar45,"loca");
      local_428._0_4_ = sVar41;
      *(stbtt_uint32 *)&psVar16[lVar88 * 0xc + 1].next = sVar41;
      sVar41 = stbtt__find_table((stbtt_uint8 *)psVar47,sVar45,"head");
      *(stbtt_uint32 *)((long)&psVar16[lVar88 * 0xc + 1].next + 4) = sVar41;
      sVar42 = stbtt__find_table((stbtt_uint8 *)psVar47,sVar45,"glyf");
      local_478._0_4_ = sVar42;
      psVar16[lVar88 * 0xc + 2].x = (short)sVar42;
      psVar16[lVar88 * 0xc + 2].y = (short)(sVar42 >> 0x10);
      sVar42 = stbtt__find_table((stbtt_uint8 *)psVar47,sVar45,"hhea");
      *(stbtt_uint32 *)&psVar16[lVar88 * 0xc + 2].field_0x4 = sVar42;
      sVar43 = stbtt__find_table((stbtt_uint8 *)psVar47,sVar45,"hmtx");
      *(stbtt_uint32 *)&psVar16[lVar88 * 0xc + 2].next = sVar43;
      sVar44 = stbtt__find_table((stbtt_uint8 *)psVar47,sVar45,"kern");
      *(stbtt_uint32 *)((long)&psVar16[lVar88 * 0xc + 2].next + 4) = sVar44;
      local_448 = CONCAT44(local_448._4_4_,sVar45);
      sVar45 = stbtt__find_table((stbtt_uint8 *)psVar47,sVar45,"GPOS");
      psVar16[lVar88 * 0xc + 3].x = (short)sVar45;
      psVar16[lVar88 * 0xc + 3].y = (short)(sVar45 >> 0x10);
      if ((((sVar40 == 0) || (sVar41 == 0)) || (sVar42 == 0)) || (sVar43 == 0)) {
LAB_00175b79:
        local_480->TexWidth = 0;
        local_480->TexHeight = 0;
        psVar47 = local_3f8;
        goto LAB_00175b8b;
      }
      if (local_478._0_4_ == 0) {
        charstrings = 0;
        fdarrayoff = 0;
        cstype = 2;
        x0_1 = 0;
        sVar45 = stbtt__find_table((stbtt_uint8 *)psVar47,(stbtt_uint32)(float)local_448,"CFF ");
        if (sVar45 != 0) {
          psVar1 = psVar16 + lVar88 * 0xc + 4;
          psVar2 = psVar16 + lVar88 * 0xc + 9;
          psVar2->x = 0;
          psVar2->y = 0;
          *(undefined4 *)&psVar2->field_0x4 = 0;
          psVar16[lVar88 * 0xc + 9].next = (stbrp_node *)0x0;
          psVar2 = psVar16 + lVar88 * 0xc + 8;
          psVar2->x = 0;
          psVar2->y = 0;
          *(undefined4 *)&psVar2->field_0x4 = 0;
          psVar16[lVar88 * 0xc + 8].next = (stbrp_node *)0x0;
          *(stbtt_uint8 **)(psVar16 + lVar88 * 0xc + 4) =
               (stbtt_uint8 *)((long)&psVar47->x + (ulong)sVar45);
          psVar16[lVar88 * 0xc + 4].next = (stbrp_node *)0x2000000000000000;
          uVar4._0_2_ = psVar1->x;
          uVar4._2_2_ = psVar1->y;
          uVar4._4_4_ = *(undefined4 *)&psVar1->field_0x4;
          b.data._0_4_ = (int)uVar4;
          b.cursor = (int)psVar16[lVar88 * 0xc + 4].next;
          b.size = (int)((ulong)psVar16[lVar88 * 0xc + 4].next >> 0x20);
          b.data._4_4_ = uVar4._4_4_;
          stbtt__buf_skip(&b,2);
          lVar48 = (long)b.cursor;
          uVar70 = 0;
          if (b.cursor < b.size) {
            b.cursor = b.cursor + 1;
            uVar70 = (uint)*(byte *)(CONCAT44(b.data._4_4_,(int)b.data) + lVar48);
          }
          stbtt__buf_seek(&b,uVar70);
          stbtt__cff_get_index(&b);
          sVar116 = stbtt__cff_get_index(&b);
          _y0 = stbtt__cff_index_get(sVar116,0);
          stbtt__cff_get_index(&b);
          sVar116 = stbtt__cff_get_index(&b);
          *(stbtt__buf *)(psVar16 + lVar88 * 0xc + 6) = sVar116;
          stbtt__dict_get_ints((stbtt__buf *)&y0,0x11,1,&charstrings);
          stbtt__dict_get_ints((stbtt__buf *)&y0,0x106,1,&cstype);
          stbtt__dict_get_ints((stbtt__buf *)&y0,0x124,1,&fdarrayoff);
          stbtt__dict_get_ints((stbtt__buf *)&y0,0x125,1,(stbtt_uint32 *)&x0_1);
          sVar116.data._4_4_ = b.data._4_4_;
          sVar116.data._0_4_ = (int)b.data;
          sVar116.cursor = b.cursor;
          sVar116.size = b.size;
          sVar116 = stbtt__get_subrs(sVar116,_y0);
          iVar67 = x0_1;
          sVar45 = charstrings;
          *(stbtt__buf *)(psVar16 + lVar88 * 0xc + 7) = sVar116;
          if ((cstype == 2) && (charstrings != 0)) {
            if (fdarrayoff != 0) {
              if (x0_1 == 0) goto LAB_00175b79;
              stbtt__buf_seek(&b,fdarrayoff);
              sVar116 = stbtt__cff_get_index(&b);
              *(stbtt__buf *)(psVar16 + lVar88 * 0xc + 8) = sVar116;
              sVar116 = stbtt__buf_range(&b,iVar67,b.size - iVar67);
              *(stbtt__buf *)(psVar16 + lVar88 * 0xc + 9) = sVar116;
            }
            stbtt__buf_seek(&b,sVar45);
            sVar116 = stbtt__cff_get_index(&b);
            *(stbtt__buf *)(psVar16 + lVar88 * 0xc + 5) = sVar116;
            goto LAB_00175a14;
          }
        }
        goto LAB_00175b79;
      }
      if (local_428._0_4_ == 0) goto LAB_00175b79;
LAB_00175a14:
      sVar45 = stbtt__find_table((stbtt_uint8 *)psVar47,(stbtt_uint32)(float)local_448,"maxp");
      if (sVar45 == 0) {
        uVar70 = 0xffff;
      }
      else {
        uVar70 = (uint)(ushort)(*(ushort *)(&psVar47->field_0x4 + sVar45) << 8 |
                               *(ushort *)(&psVar47->field_0x4 + sVar45) >> 8);
      }
      *(uint *)&psVar16[lVar88 * 0xc + 1].field_0x4 = uVar70;
      uVar58 = *(ushort *)((long)&psVar47->y + (ulong)sVar40);
      *(undefined4 *)&psVar16[lVar88 * 0xc + 3].field_0x4 = 0;
      uVar68 = (ulong)(ushort)(uVar58 << 8 | uVar58 >> 8);
      uVar70 = sVar40 + 4;
      iVar67 = 0;
      while (bVar92 = uVar68 != 0, uVar68 = uVar68 - 1, bVar92) {
        uVar78 = (ulong)uVar70;
        uVar58 = *(ushort *)((long)&psVar47->x + uVar78);
        uVar58 = uVar58 << 8 | uVar58 >> 8;
        if ((uVar58 == 0) ||
           ((uVar58 == 3 &&
            ((uVar58 = *(ushort *)((long)&psVar47->y + uVar78), uVar58 = uVar58 << 8 | uVar58 >> 8,
             uVar58 == 10 || (uVar58 == 1)))))) {
          sVar45 = ttULONG(&psVar47->field_0x4 + uVar78);
          iVar67 = sVar45 + sVar40;
          *(int *)&psVar16[lVar88 * 0xc + 3].field_0x4 = iVar67;
        }
        uVar70 = uVar70 + 8;
      }
      if (iVar67 == 0) goto LAB_00175b79;
      uVar58 = *(ushort *)
                ((long)&psVar47[3].y + (long)*(int *)((long)&psVar16[lVar88 * 0xc + 1].next + 4));
      *(uint *)&psVar16[lVar88 * 0xc + 3].next = (uint)(ushort)(uVar58 << 8 | uVar58 >> 8);
      lVar88 = local_458._0_8_ + 1;
    }
    lVar88 = (long)(int)local_3f0;
    size_00 = lVar88 * 0x1c;
    pvVar49 = ImGui::MemAlloc(size_00);
    size = lVar88 << 4;
    pvVar50 = ImGui::MemAlloc(size);
    lVar88 = (long)(int)local_430;
    __s = ImGui::MemAlloc(lVar88 * 0x28);
    local_300 = pvVar49;
    memset(pvVar49,0,size_00);
    local_318 = pvVar50;
    memset(pvVar50,0,size);
    local_310 = __s;
    memset(__s,0,lVar88 * 0x28);
    uVar68 = 0;
    local_3c0 = (ulong)local_3c0._4_4_ << 0x20;
    lVar88 = 0;
    iVar67 = 0;
    while (pIVar11 = local_480, lVar88 < local_3d0->Size) {
      pvVar46 = ImVector<ImFontConfig>::operator[](local_3d0,(int)lVar88);
      psVar90 = (stbtt_fontinfo *)(local_3f8 + lVar88 * 0xc);
      pIVar60 = pvVar46->GlyphRanges;
      local_3b0 = 0;
      _y0_2 = 0;
      while( true ) {
        if ((pIVar60[local_3b0 * 2] == 0) || (pIVar60[local_3b0 * 2 + 1] == 0)) break;
        _y0_2 = (ulong)(((int)_y0_2 - (uint)pIVar60[local_3b0 * 2]) +
                        (uint)pIVar60[local_3b0 * 2 + 1] + 1);
        local_3b0 = local_3b0 + 1;
      }
      local_348 = uVar68 & 0xffffffff;
      pfVar66 = (float *)(local_348 * 0x28 + (long)local_310);
      *(float **)&psVar90[1].fontstart = pfVar66;
      psVar90[1].loca = (int)local_3b0;
      fVar94 = pvVar46->SizePixels;
      for (uVar68 = 0; local_3b0 != uVar68; uVar68 = uVar68 + 1) {
        *pfVar66 = fVar94;
        uVar58 = pIVar60[uVar68 * 2];
        pfVar66[1] = (float)(uint)uVar58;
        iVar69 = (uint)pIVar60[uVar68 * 2 + 1] - (uint)uVar58;
        pfVar66[4] = (float)(iVar69 + 1);
        *(void **)(pfVar66 + 6) = (void *)((long)iVar67 * 0x1c + (long)local_300);
        iVar67 = iVar69 + iVar67 + 1;
        pfVar66 = pfVar66 + 10;
      }
      local_3e8 = (undefined8 *)CONCAT44(local_3e8._4_4_,iVar67);
      psVar90[1].userdata = (void *)((long)(int)local_3c0 * 0x10 + (long)local_318);
      *(int *)&psVar90[1].data = (int)_y0_2;
      local_3c8 = lVar88;
      stbtt_PackSetOversampling(&local_3a0,pvVar46->OversampleH,pvVar46->OversampleV);
      uVar4 = local_3a0._32_8_;
      local_340._0_4_ = psVar90[1].fontstart;
      local_340._4_4_ = psVar90[1].numGlyphs;
      uVar78 = 0;
      uVar68 = (ulong)(uint)psVar90[1].loca;
      if (psVar90[1].loca < 1) {
        uVar68 = uVar78;
      }
      uVar89 = local_3a0._32_8_ & 0xffffffff;
      local_3fc = (float)uVar89;
      local_468 = (stbtt__point *)((ulong)local_3a0._32_8_ >> 0x20);
      local_3a8 = (uchar *)CONCAT44(local_3a8._4_4_,(float)(long)local_468);
      sVar17 = (short)local_3a0.v_oversample;
      sVar18 = (short)local_3a0.padding;
      local_328._0_8_ = (long)psVar90[1].userdata + 6;
      iVar67 = 0;
      while (lVar88 = local_340, uVar78 != uVar68) {
        local_458._0_8_ = uVar78;
        fVar94 = *(float *)(local_340 + uVar78 * 0x28);
        if (fVar94 <= 0.0) {
          uVar113 = 0x80000000;
          uStack_43c = 0x80000000;
          fVar94 = -fVar94 / (float)(ushort)(*(ushort *)(psVar90->data + (long)psVar90->head + 0x12)
                                             << 8 | *(ushort *)
                                                     (psVar90->data + (long)psVar90->head + 0x12) >>
                                                    8);
        }
        else {
          fVar94 = stbtt_ScaleForPixelHeight(psVar90,fVar94);
          uVar113 = extraout_XMM0_Db;
          uStack_43c = extraout_XMM0_Dd;
        }
        lVar88 = uVar78 * 0x28 + lVar88;
        *(char *)(lVar88 + 0x20) = (char)uVar89;
        *(char *)(lVar88 + 0x21) = (char)local_468;
        local_428._0_4_ = iVar67;
        local_478._0_4_ = fVar94 * local_3fc;
        local_448 = CONCAT44(uVar113,fVar94 * local_3a8._0_4_);
        uStack_440 = 0;
        psVar91 = (short *)((long)iVar67 * 0x10 + local_328._0_8_);
        for (lVar48 = 0; lVar48 < *(int *)(lVar88 + 0x10); lVar48 = lVar48 + 1) {
          if (*(long *)(lVar88 + 8) == 0) {
            iVar67 = *(int *)(lVar88 + 4) + (int)lVar48;
          }
          else {
            iVar67 = *(int *)(*(long *)(lVar88 + 8) + lVar48 * 4);
          }
          iVar67 = stbtt_FindGlyphIndex(psVar90,iVar67);
          stbtt_GetGlyphBitmapBoxSubpixel
                    (psVar90,iVar67,(float)local_478._0_4_,(float)local_448,in_XMM2._0_4_,
                     in_XMM3._0_4_,(int *)&b,&y0,(int *)&cstype,(int *)&charstrings);
          psVar91[-1] = (((short)cstype + (short)uVar4) - (short)(int)b.data) + sVar18 + -1;
          *psVar91 = ~(ushort)y0 + (short)charstrings + sVar17 + sVar18;
          psVar91 = psVar91 + 8;
        }
        iVar67 = local_428._0_4_ + (int)lVar48;
        uVar78 = local_458._0_8_ + 1;
      }
      if (iVar67 != (int)_y0_2) {
        __assert_fail("n == font_glyphs_count",
                      "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui_draw.cpp"
                      ,0x704,"bool ImFontAtlasBuildWithStbTruetype(ImFontAtlas *)");
      }
      uVar68 = local_348 + local_3b0;
      local_3c0 = CONCAT44(local_3c0._4_4_,(int)local_3c0 + (int)_y0_2);
      lVar48 = 0;
      for (lVar88 = 0; uVar78 = _y0_2, lVar88 < psVar90[1].loca; lVar88 = lVar88 + 1) {
        uVar78 = (long)(int)lVar48 << 4 | 6;
        lVar83 = 0;
        while( true ) {
          if (*(int *)(*(long *)&psVar90[1].fontstart + 0x10 + lVar88 * 0x28) <= (int)lVar83) break;
          iVar67 = stbtt_FindGlyphIndex
                             (psVar90,*(int *)(*(long *)&psVar90[1].fontstart + lVar88 * 0x28 + 4) +
                                      (int)lVar83);
          if (iVar67 == 0) {
            *(undefined4 *)((long)psVar90[1].userdata + (uVar78 - 2)) = 0;
          }
          lVar83 = lVar83 + 1;
          uVar78 = uVar78 + 0x10;
        }
        lVar48 = (int)lVar48 + lVar83;
      }
      iVar67 = (int)_y0_2;
      stbrp_pack_rects((stbrp_context *)local_3a0.pack_info,(stbrp_rect *)psVar90[1].userdata,iVar67
                      );
      uVar78 = uVar78 & 0xffffffff;
      if (iVar67 < 1) {
        uVar78 = 0;
      }
      for (lVar88 = 0; uVar78 * 0x10 != lVar88; lVar88 = lVar88 + 0x10) {
        pvVar49 = psVar90[1].userdata;
        if ((*(short *)((long)pvVar49 + lVar88 + 4) == 0) &&
           (*(short *)((long)pvVar49 + lVar88 + 6) == 0)) {
          *(undefined4 *)((long)pvVar49 + lVar88 + 0xc) = 0;
        }
        if (*(int *)((long)pvVar49 + lVar88 + 0xc) != 0) {
          iVar67 = (uint)*(ushort *)((long)pvVar49 + lVar88 + 6) +
                   (uint)*(ushort *)((long)pvVar49 + lVar88 + 10);
          if (iVar67 < local_480->TexHeight) {
            iVar67 = local_480->TexHeight;
          }
          local_480->TexHeight = iVar67;
        }
      }
      iVar67 = (int)local_3e8;
      lVar88 = local_3c8 + 1;
    }
    if ((int)local_3c0 != (int)local_3f0) {
      __assert_fail("buf_rects_n == total_glyphs_count",
                    "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui_draw.cpp"
                    ,0x71b,"bool ImFontAtlasBuildWithStbTruetype(ImFontAtlas *)");
    }
    if (iVar67 != (int)local_3f0) {
      __assert_fail("buf_packedchars_n == total_glyphs_count",
                    "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui_draw.cpp"
                    ,0x71c,"bool ImFontAtlasBuildWithStbTruetype(ImFontAtlas *)");
    }
    if ((int)uVar68 != (int)local_430) {
      __assert_fail("buf_ranges_n == total_ranges_count",
                    "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui_draw.cpp"
                    ,0x71d,"bool ImFontAtlasBuildWithStbTruetype(ImFontAtlas *)");
    }
    uVar70 = local_480->TexHeight;
    if ((local_480->Flags & 1) == 0) {
      uVar70 = (int)(uVar70 - 1) >> 1 | uVar70 - 1;
      uVar70 = (int)uVar70 >> 2 | uVar70;
      uVar70 = (int)uVar70 >> 4 | uVar70;
      uVar70 = (int)uVar70 >> 8 | uVar70;
      uVar70 = (int)uVar70 >> 0x10 | uVar70;
    }
    iVar67 = uVar70 + 1;
    local_480->TexHeight = iVar67;
    auVar99._0_4_ = (float)local_480->TexWidth;
    auVar99._4_4_ = (float)iVar67;
    auVar99._8_8_ = 0;
    auVar99 = divps(_DAT_001a3a40,auVar99);
    local_480->TexUvScale = auVar99._0_8_;
    puVar51 = (uchar *)ImGui::MemAlloc((long)(iVar67 * local_480->TexWidth));
    pIVar11->TexPixelsAlpha8 = puVar51;
    memset(puVar51,0,(long)pIVar11->TexHeight * (long)pIVar11->TexWidth);
    local_3a0.pixels = pIVar11->TexPixelsAlpha8;
    local_3a0.height = pIVar11->TexHeight;
    lVar88 = 0;
    while (this_00 = local_3d0, lVar88 < local_3d0->Size) {
      local_2c0 = ImVector<ImFontConfig>::operator[](local_3d0,(int)lVar88);
      psVar16 = local_3f8;
      local_410 = (stbtt_fontinfo *)(local_3f8 + lVar88 * 0xc);
      local_2b8 = lVar88;
      stbtt_PackSetOversampling(&local_3a0,local_2c0->OversampleH,local_2c0->OversampleV);
      psVar47 = psVar16 + lVar88 * 0xc + 10;
      lVar48._0_2_ = psVar47->x;
      lVar48._2_2_ = psVar47->y;
      lVar48._4_4_ = *(undefined4 *)&psVar47->field_0x4;
      psVar47 = psVar16 + lVar88 * 0xc + 0xb;
      local_2b0._0_2_ = psVar47->x;
      local_2b0._2_2_ = psVar47->y;
      local_2b0._4_4_ = *(undefined4 *)&psVar47->field_0x4;
      local_268._0_4_ = local_3a0.h_oversample;
      local_268._4_4_ = local_3a0.v_oversample;
      uStack_260 = 0;
      uVar70 = *(uint *)&psVar16[lVar88 * 0xc + 0xb].next;
      if ((int)*(uint *)&psVar16[lVar88 * 0xc + 0xb].next < 1) {
        uVar70 = 0;
      }
      local_2a8 = (ulong)uVar70;
      lVar88 = 0;
      uVar68 = 0;
      local_308 = lVar48;
      while (lVar83 = local_2b0, uVar68 != local_2a8) {
        fVar94 = *(float *)(local_2b0 + uVar68 * 0x28);
        local_298 = uVar68;
        if (fVar94 <= 0.0) {
          uStack_2d4 = 0x80000000;
          uStack_2d0 = 0x80000000;
          uStack_2cc = 0x80000000;
          local_2d8 = -fVar94 / (float)(ushort)(*(ushort *)
                                                 (local_410->data + (long)local_410->head + 0x12) <<
                                                8 | *(ushort *)
                                                     (local_410->data + (long)local_410->head + 0x12
                                                     ) >> 8);
        }
        else {
          local_2d8 = stbtt_ScaleForPixelHeight(local_410,fVar94);
          uStack_2d4 = extraout_XMM0_Db_00;
          uStack_2d0 = extraout_XMM0_Dc;
          uStack_2cc = extraout_XMM0_Dd_00;
        }
        lVar83 = uVar68 * 0x28 + lVar83;
        uVar68 = *(ulong *)(lVar83 + 0x20);
        auVar19._8_6_ = 0;
        auVar19._0_8_ = uVar68;
        auVar19[0xe] = (char)(uVar68 >> 0x38);
        auVar21._8_4_ = 0;
        auVar21._0_8_ = uVar68;
        auVar21[0xc] = (char)(uVar68 >> 0x30);
        auVar21._13_2_ = auVar19._13_2_;
        auVar22._8_4_ = 0;
        auVar22._0_8_ = uVar68;
        auVar22._12_3_ = auVar21._12_3_;
        auVar23._8_2_ = 0;
        auVar23._0_8_ = uVar68;
        auVar23[10] = (char)(uVar68 >> 0x28);
        auVar23._11_4_ = auVar22._11_4_;
        auVar24._8_2_ = 0;
        auVar24._0_8_ = uVar68;
        auVar24._10_5_ = auVar23._10_5_;
        auVar26[8] = (char)(uVar68 >> 0x20);
        auVar26._0_8_ = uVar68;
        auVar26._9_6_ = auVar24._9_6_;
        auVar28._7_8_ = 0;
        auVar28._0_7_ = auVar26._8_7_;
        cVar98 = (char)(uVar68 >> 0x18);
        Var29 = CONCAT81(SUB158(auVar28 << 0x40,7),cVar98);
        auVar36._9_6_ = 0;
        auVar36._0_9_ = Var29;
        cVar97 = (char)(uVar68 >> 0x10);
        auVar30._1_10_ = SUB1510(auVar36 << 0x30,5);
        auVar30[0] = cVar97;
        auVar37._11_4_ = 0;
        auVar37._0_11_ = auVar30;
        cVar96 = (char)(uVar68 >> 8);
        auVar31._1_12_ = SUB1512(auVar37 << 0x20,3);
        auVar31[0] = cVar96;
        bVar93 = (byte)uVar68;
        uVar58 = CONCAT11(0,bVar93);
        auVar27._2_13_ = auVar31;
        auVar27._0_2_ = uVar58;
        uVar78 = (ulong)uVar58;
        sVar101 = 1 - auVar31._0_2_;
        sVar17 = -auVar30._0_2_;
        uVar39 = (ushort)Var29;
        sVar18 = -uVar39;
        auVar20._10_2_ = 0;
        auVar20._0_10_ = auVar27._0_10_;
        auVar20._12_2_ = uVar39;
        uVar38 = CONCAT42(auVar20._10_4_,auVar30._0_2_);
        auVar32._6_8_ = 0;
        auVar32._0_6_ = uVar38;
        Var33 = CONCAT82(SUB148(auVar32 << 0x40,6),auVar31._0_2_);
        auVar25._4_10_ = Var33;
        auVar25._0_4_ = CONCAT22(0,uVar58);
        local_3a0._32_8_ = auVar25._0_8_;
        auVar103._0_4_ = (float)CONCAT22(0,uVar58);
        uVar70 = (uint)Var33;
        auVar103._4_4_ = (float)uVar70;
        auVar103._8_4_ = (float)(int)uVar38;
        auVar103._12_4_ = (float)uVar39;
        auVar99 = divps(_DAT_001a3a40,auVar103);
        auVar109[0] = -(bVar93 == 0);
        auVar109[1] = -(bVar93 == 0);
        auVar109[2] = -(bVar93 == 0);
        auVar109[3] = -(bVar93 == 0);
        auVar109[4] = -(cVar96 == '\0');
        auVar109[5] = -(cVar96 == '\0');
        auVar109[6] = -(cVar96 == '\0');
        auVar109[7] = -(cVar96 == '\0');
        auVar109[8] = -(cVar97 == '\0');
        auVar109[9] = -(cVar97 == '\0');
        auVar109[10] = -(cVar97 == '\0');
        auVar109[0xb] = -(cVar97 == '\0');
        auVar109[0xc] = -(cVar98 == '\0');
        auVar109[0xd] = -(cVar98 == '\0');
        auVar109[0xe] = -(cVar98 == '\0');
        auVar109[0xf] = -(cVar98 == '\0');
        Var33 = CONCAT64(CONCAT42(CONCAT22(sVar18,sVar18),sVar17),CONCAT22(sVar17,sVar18));
        auVar34._4_8_ = (long)((unkuint10)Var33 >> 0x10);
        auVar34._2_2_ = sVar101;
        auVar34._0_2_ = sVar101;
        auVar100._0_4_ = (float)(int)(short)(1 - uVar58);
        auVar100._4_4_ = (float)(auVar34._0_4_ >> 0x10);
        auVar100._8_4_ = (float)((int)((unkuint10)Var33 >> 0x10) >> 0x10);
        auVar100._12_4_ = (float)(int)sVar18;
        auVar104._0_4_ = auVar103._0_4_ + auVar103._0_4_;
        auVar104._4_4_ = auVar103._4_4_ + auVar103._4_4_;
        auVar104._8_4_ = auVar103._8_4_ + auVar103._8_4_;
        auVar104._12_4_ = auVar103._12_4_ + auVar103._12_4_;
        local_248 = divps(auVar100,auVar104);
        local_248 = ~auVar109 & local_248;
        lVar88 = (long)(int)lVar88;
        uVar68 = (ulong)uVar70;
        lVar64 = 0;
        local_2f8 = lVar83;
        local_258 = auVar99;
LAB_001762a7:
        psVar90 = local_410;
        fVar94 = auVar99._0_4_;
        if (lVar64 < *(int *)(lVar83 + 0x10)) {
          if (*(int *)(lVar48 + 0xc + lVar88 * 0x10) != 0) {
            if (*(long *)(lVar83 + 8) == 0) {
              iVar67 = *(int *)(lVar83 + 4) + (int)lVar64;
            }
            else {
              iVar67 = *(int *)(*(long *)(lVar83 + 8) + lVar64 * 4);
            }
            lVar48 = lVar88 * 0x10 + lVar48;
            local_278 = (uint *)(lVar64 * 0x1c + *(long *)(lVar83 + 0x18));
            local_2f0 = lVar64;
            local_2e8 = lVar88;
            iVar69 = stbtt_FindGlyphIndex(local_410,iVar67);
            uVar4 = *(undefined8 *)(lVar48 + 4);
            auVar99 = pshuflw(ZEXT416((uint)local_3a0.padding),ZEXT416((uint)local_3a0.padding),0);
            local_478._4_4_ =
                 CONCAT22((short)((ulong)uVar4 >> 0x30) + auVar99._6_2_,
                          (short)((ulong)uVar4 >> 0x20) + auVar99._4_2_);
            *(ulong *)(lVar48 + 4) =
                 CONCAT44(local_478._4_4_,
                          CONCAT22((short)((ulong)uVar4 >> 0x10) - auVar99._2_2_,
                                   (short)uVar4 - auVar99._0_2_));
            puVar51 = psVar90->data;
            uVar58 = *(ushort *)(puVar51 + (long)psVar90->hhea + 0x22) << 8 |
                     *(ushort *)(puVar51 + (long)psVar90->hhea + 0x22) >> 8;
            iVar67 = psVar90->hmtx;
            lVar88 = (ulong)uVar58 * 4 + (long)iVar67 + -4;
            lVar83 = (ulong)uVar58 * 4 + (long)iVar67 + -3;
            if (iVar69 < (int)(uint)uVar58) {
              lVar88 = (long)(iVar69 * 4) + (long)iVar67;
              lVar83 = (long)(iVar69 * 4) + 1 + (long)iVar67;
            }
            local_334 = (uint)puVar51[lVar88];
            local_338 = (uint)puVar51[lVar83];
            local_478._0_4_ = (float)uVar78 * local_2d8;
            local_478._8_4_ = local_478._4_4_;
            local_478._12_4_ = local_478._4_4_;
            local_458._4_12_ = auVar99._4_12_;
            local_458._0_4_ = (float)uVar68 * local_2d8;
            fVar112 = local_2d8;
            stbtt_GetGlyphBitmapBoxSubpixel
                      (psVar90,iVar69,(float)uVar78 * local_2d8,(float)local_458._0_4_,local_2d8,
                       fVar94,&x0_1,&y0_1,&x1_1,&local_270);
            local_3a8 = local_3a0.pixels + *(ushort *)(lVar48 + 8);
            uVar58 = *(ushort *)(lVar48 + 10);
            local_2e0 = (long)local_3a0.stride_in_bytes;
            iVar67 = (uint)*(ushort *)(lVar48 + 4) - (int)uVar78;
            uVar39 = *(ushort *)(lVar48 + 6);
            local_350 = lVar48;
            uVar70 = stbtt_GetGlyphShape(psVar90,iVar69,(stbtt_vertex **)&cstype);
            stbtt_GetGlyphBitmapBoxSubpixel
                      (psVar90,iVar69,(float)local_478._0_4_,(float)local_458._0_4_,fVar112,fVar94,
                       (int *)&charstrings,(int *)&fdarrayoff,(int *)0x0,(int *)0x0);
            uVar82 = iVar67 + 1;
            if ((uVar82 != 0) && (uVar85 = ((uint)uVar39 - (int)uVar68) + 1, uVar85 != 0)) {
              local_3a8 = local_3a8 + (ulong)uVar58 * local_2e0;
              lVar88 = CONCAT44(uStack_404,cstype);
              _y0_2 = CONCAT44(uStack_484,charstrings);
              local_358 = (ulong)fdarrayoff;
              uVar78 = 0;
              uVar68 = (ulong)uVar70;
              if ((int)uVar70 < 1) {
                uVar68 = uVar78;
              }
              uVar89 = 0;
              for (; uVar68 * 0xe - uVar78 != 0; uVar78 = uVar78 + 0xe) {
                uVar89 = (ulong)((int)uVar89 + (uint)(*(char *)(lVar88 + 0xc + uVar78) == '\x01'));
              }
              local_3b4 = uVar82;
              if (((int)uVar89 != 0) &&
                 (local_468 = (stbtt__point *)ImGui::MemAlloc(uVar89 * 4),
                 local_468 != (stbtt__point *)0x0)) {
                local_428._0_8_ = uVar89;
                fVar94 = (float)local_458._0_4_;
                if ((float)local_478._0_4_ <= (float)local_458._0_4_) {
                  fVar94 = (float)local_478._0_4_;
                }
                fVar94 = (0.35 / fVar94) * (0.35 / fVar94);
                psVar52 = (stbtt__point *)0x0;
                iVar87 = 0;
                iVar71 = 0;
                iVar69 = 0;
                local_360 = (ulong)uVar85;
                do {
                  if (iVar71 == 1) {
                    psVar52 = (stbtt__point *)ImGui::MemAlloc((long)iVar69 << 3);
                    if (psVar52 == (stbtt__point *)0x0) {
                      ImGui::MemFree((void *)0x0);
                      psVar52 = local_468;
                      goto LAB_00177256;
                    }
                  }
                  else if (iVar71 == 2) goto LAB_0017670a;
                  local_448 = CONCAT44(local_448._4_4_,iVar71);
                  b.data._0_4_ = 0;
                  fVar112 = 0.0;
                  fVar102 = 0.0;
                  uVar70 = 0xffffffff;
                  for (lVar48 = 0; uVar68 * 0xe - lVar48 != 0; lVar48 = lVar48 + 0xe) {
                    iVar69 = (int)b.data;
                    switch(*(undefined1 *)(lVar88 + 0xc + lVar48)) {
                    case 1:
                      if (-1 < (int)uVar70) {
                        (&local_468->x)[uVar70] = (float)((int)b.data - iVar87);
                      }
                      uVar70 = uVar70 + 1;
                      auVar99 = pshuflw(ZEXT416(*(uint *)(lVar88 + lVar48)),
                                        ZEXT416(*(uint *)(lVar88 + lVar48)),0x60);
                      fVar112 = (float)(auVar99._0_4_ >> 0x10);
                      fVar102 = (float)(auVar99._4_4_ >> 0x10);
                      iVar87 = (int)b.data;
                      iVar69 = (int)b.data + 1;
                      if (psVar52 != (stbtt__point *)0x0) {
                        psVar52[(int)b.data].x = fVar112;
                        psVar52[(int)b.data].y = fVar102;
                      }
                      break;
                    case 2:
                      auVar99 = pshuflw(ZEXT416(*(uint *)(lVar88 + lVar48)),
                                        ZEXT416(*(uint *)(lVar88 + lVar48)),0x60);
                      fVar112 = (float)(auVar99._0_4_ >> 0x10);
                      fVar102 = (float)(auVar99._4_4_ >> 0x10);
                      iVar69 = (int)b.data + 1;
                      if (psVar52 != (stbtt__point *)0x0) {
                        psVar52[(int)b.data].x = fVar112;
                        psVar52[(int)b.data].y = fVar102;
                      }
                      break;
                    case 3:
                      stbtt__tesselate_curve
                                (psVar52,(int *)&b,fVar112,fVar102,
                                 (float)(int)*(short *)(lVar88 + 4 + lVar48),
                                 (float)(int)*(short *)(lVar88 + 6 + lVar48),
                                 (float)(int)*(short *)(lVar88 + lVar48),
                                 (float)(int)*(short *)(lVar88 + 2 + lVar48),fVar94,0);
                      goto LAB_00176696;
                    case 4:
                      stbtt__tesselate_cubic
                                (psVar52,(int *)&b,fVar112,fVar102,
                                 (float)(int)*(short *)(lVar88 + 4 + lVar48),
                                 (float)(int)*(short *)(lVar88 + 6 + lVar48),
                                 (float)(int)*(short *)(lVar88 + 8 + lVar48),
                                 (float)(int)*(short *)(lVar88 + 10 + lVar48),
                                 (float)(int)*(short *)(lVar88 + lVar48),
                                 (float)(int)*(short *)(lVar88 + 2 + lVar48),fVar94,0);
LAB_00176696:
                      auVar99 = pshuflw(ZEXT416(*(uint *)(lVar88 + lVar48)),
                                        ZEXT416(*(uint *)(lVar88 + lVar48)),0x60);
                      fVar112 = (float)(auVar99._0_4_ >> 0x10);
                      fVar102 = (float)(auVar99._4_4_ >> 0x10);
                      iVar69 = (int)b.data;
                    }
                    b.data._0_4_ = iVar69;
                  }
                  (&local_468->x)[(int)uVar70] = (float)((int)b.data - iVar87);
                  iVar71 = (int)(float)local_448 + 1;
                  iVar69 = (int)b.data;
                } while( true );
              }
            }
            goto LAB_0017725b;
          }
          goto LAB_001777d2;
        }
        uVar68 = local_298 + 1;
      }
      local_3a0.h_oversample = (undefined4)local_268;
      local_3a0.v_oversample = local_268._4_4_;
      fVar94 = local_2c0->RasterizerMultiply;
      if ((fVar94 != 1.0) || (NAN(fVar94))) {
        ImFontAtlasBuildMultiplyCalcLookupTable((uchar *)&b,fVar94);
        puVar51 = local_3a0.pixels;
        iVar67 = local_3a0.stride_in_bytes;
        pvVar49 = local_410[1].userdata;
        for (pvVar50 = pvVar49;
            pvVar50 != (void *)((long)*(int *)&local_410[1].data * 0x10 + (long)pvVar49);
            pvVar50 = (void *)((long)pvVar50 + 0x10)) {
          if (*(int *)((long)pvVar50 + 0xc) != 0) {
            ImFontAtlasBuildMultiplyRectAlpha8
                      ((uchar *)&b,puVar51,(uint)*(ushort *)((long)pvVar50 + 8),
                       (uint)*(ushort *)((long)pvVar50 + 10),(uint)*(ushort *)((long)pvVar50 + 4),
                       (uint)*(ushort *)((long)pvVar50 + 6),iVar67);
            pvVar49 = local_410[1].userdata;
          }
        }
      }
      local_410[1].userdata = (void *)0x0;
      lVar88 = local_2b8 + 1;
    }
    ImGui::MemFree(local_3a0.nodes);
    ImGui::MemFree(local_3a0.pack_info);
    ImGui::MemFree(local_318);
    for (lVar88 = 0; lVar88 < this_00->Size; lVar88 = lVar88 + 1) {
      pvVar46 = ImVector<ImFontConfig>::operator[](this_00,(int)lVar88);
      this = pvVar46->DstFont;
      if (pvVar46->MergeMode == true) {
        ImFont::BuildLookupTable(this);
      }
      psVar90 = (stbtt_fontinfo *)(local_3f8 + lVar88 * 0xc);
      fVar94 = stbtt_ScaleForPixelHeight(psVar90,pvVar46->SizePixels);
      uVar58 = *(ushort *)(psVar90->data + (long)psVar90->hhea + 4);
      uVar39 = *(ushort *)(psVar90->data + (long)psVar90->hhea + 6);
      uVar58 = uVar58 << 8 | uVar58 >> 8;
      fVar112 = -1.0;
      if (0 < (short)uVar58) {
        fVar112 = 1.0;
      }
      uVar39 = uVar39 << 8 | uVar39 >> 8;
      fVar102 = -1.0;
      if (0 < (short)uVar39) {
        fVar102 = 1.0;
      }
      ImFontAtlasBuildSetupFont
                (local_480,this,pvVar46,(float)(int)((float)(int)(short)uVar58 * fVar94 + fVar112),
                 (float)(int)((float)(int)(short)uVar39 * fVar94 + fVar102));
      local_448 = CONCAT44(local_448._4_4_,(pvVar46->GlyphOffset).x);
      local_478 = ZEXT416((uint)((float)(int)(this->Ascent + 0.5) + (pvVar46->GlyphOffset).y));
      local_428._0_8_ = psVar90;
      lVar48 = 0;
      while (lVar48 < psVar90[1].loca) {
        local_458._0_8_ = lVar48;
        lVar83 = lVar48 * 0x28 + *(long *)&psVar90[1].fontstart;
        lVar48 = 0;
        for (lVar64 = 0; lVar64 < *(int *)(lVar83 + 0x10); lVar64 = lVar64 + 1) {
          lVar14 = *(long *)(lVar83 + 0x18);
          uVar58 = *(ushort *)(lVar14 + lVar48);
          if ((((uVar58 != 0) || (*(short *)(lVar14 + 4 + lVar48) != 0)) ||
              (*(short *)(lVar14 + 2 + lVar48) != 0)) || (*(short *)(lVar14 + 6 + lVar48) != 0)) {
            c = (short)*(undefined4 *)(lVar83 + 4) + (short)lVar64;
            lVar65 = lVar14;
            if (pvVar46->MergeMode == true) {
              pIVar57 = ImFont::FindGlyphNoFallback(this,c);
              if (pIVar57 != (ImFontGlyph *)0x0) goto LAB_00177b95;
              lVar65 = *(long *)(lVar83 + 0x18);
              uVar58 = *(ushort *)(lVar65 + lVar48);
            }
            fVar112 = 1.0 / (float)local_480->TexHeight;
            fVar94 = 1.0 / (float)local_480->TexWidth;
            ImFont::AddGlyph(this,c,*(float *)(lVar65 + 8 + lVar48) + 0.0 + (float)local_448,
                             *(float *)(lVar65 + 0xc + lVar48) + 0.0 + (float)local_478._0_4_,
                             *(float *)(lVar65 + 0x14 + lVar48) + 0.0 + (float)local_448,
                             *(float *)(lVar65 + 0x18 + lVar48) + 0.0 + (float)local_478._0_4_,
                             (float)uVar58 * fVar94,
                             (float)*(ushort *)(lVar65 + 2 + lVar48) * fVar112,
                             (float)*(ushort *)(lVar65 + 4 + lVar48) * fVar94,
                             (float)*(ushort *)(lVar65 + 6 + lVar48) * fVar112,
                             *(float *)(lVar14 + 0x10 + lVar48));
          }
LAB_00177b95:
          lVar48 = lVar48 + 0x1c;
        }
        psVar90 = (stbtt_fontinfo *)local_428._0_8_;
        lVar48 = local_458._0_8_ + 1;
      }
      this_00 = local_3d0;
    }
    ImGui::MemFree(local_300);
    ImGui::MemFree(local_310);
    ImGui::MemFree(local_3f8);
    ImFontAtlasBuildFinish(local_480);
    bVar92 = true;
  }
  return bVar92;
LAB_0017670a:
  if (psVar52 != (stbtt__point *)0x0) {
    iVar69 = 0;
    lVar88 = local_428._0_8_;
    for (lVar48 = 0; local_428._0_8_ != lVar48; lVar48 = lVar48 + 1) {
      iVar69 = iVar69 + (int)(&local_468->x)[lVar48];
    }
    local_368 = psVar52;
    p_00 = (stbtt__edge *)ImGui::MemAlloc((long)(iVar69 + 1) * 0x14);
    if (p_00 != (stbtt__edge *)0x0) {
      iVar69 = 0;
      iVar87 = 0;
      for (lVar48 = 0; lVar48 != lVar88; lVar48 = lVar48 + 1) {
        fVar94 = (&local_468->x)[lVar48];
        uVar78 = (ulong)((int)fVar94 - 1);
        fVar112 = fVar94;
        for (uVar68 = 0; iVar71 = (int)uVar78, (long)uVar68 < (long)(int)fVar112;
            uVar68 = uVar68 + 1) {
          fVar102 = local_368[(long)iVar69 + (long)iVar71].y;
          fVar95 = local_368[(long)iVar69 + uVar68].y;
          if ((fVar102 != fVar95) || (NAN(fVar102) || NAN(fVar95))) {
            iVar81 = (int)uVar68;
            iVar72 = iVar71;
            if (fVar102 <= fVar95) {
              iVar72 = iVar81;
              iVar81 = iVar71;
            }
            p_00[iVar87].invert = (uint)(fVar95 < fVar102);
            sVar5 = local_368[(long)iVar69 + (long)iVar72];
            sVar6 = local_368[(long)iVar69 + (long)iVar81];
            psVar53 = p_00 + iVar87;
            psVar53->x0 = sVar5.x * (float)local_478._0_4_ + 0.0;
            psVar53->y0 = sVar5.y * -(float)local_458._0_4_ + 0.0;
            psVar53->x1 = sVar6.x * (float)local_478._0_4_ + 0.0;
            psVar53->y1 = sVar6.y * -(float)local_458._0_4_ + 0.0;
            iVar87 = iVar87 + 1;
            fVar112 = (&local_468->x)[lVar48];
          }
          uVar78 = uVar68 & 0xffffffff;
        }
        iVar69 = (int)fVar94 + iVar69;
        lVar88 = local_428._0_8_;
      }
      stbtt__sort_edges_quicksort(p_00,iVar87);
      uVar70 = local_3b4;
      psVar53 = p_00;
      for (uVar68 = 1; (long)uVar68 < (long)iVar87; uVar68 = uVar68 + 1) {
        uVar3 = p_00[uVar68].x0;
        uVar7 = p_00[uVar68].y0;
        b.cursor = p_00[uVar68].invert;
        uVar10 = p_00[uVar68].x1;
        uVar15 = p_00[uVar68].y1;
        psVar74 = psVar53;
        for (uVar78 = uVar68; 0 < (long)uVar78; uVar78 = uVar78 - 1) {
          if (psVar74->y0 <= (float)uVar7) goto LAB_001768c6;
          psVar74[1].invert = psVar74->invert;
          fVar94 = psVar74->y0;
          fVar112 = psVar74->x1;
          fVar102 = psVar74->y1;
          psVar74[1].x0 = psVar74->x0;
          psVar74[1].y0 = fVar94;
          psVar74[1].x1 = fVar112;
          psVar74[1].y1 = fVar102;
          psVar74 = psVar74 + -1;
        }
        uVar78 = 0;
LAB_001768c6:
        iVar69 = (int)uVar78;
        if (uVar68 != (uVar78 & 0xffffffff)) {
          p_00[iVar69].x0 = (float)uVar3;
          p_00[iVar69].y0 = (float)uVar7;
          p_00[iVar69].x1 = (float)uVar10;
          p_00[iVar69].y1 = (float)uVar15;
          p_00[iVar69].invert = b.cursor;
        }
        psVar53 = psVar53 + 1;
        b.data._0_4_ = uVar10;
        b.data._4_4_ = uVar15;
      }
      auVar35._8_8_ = 0;
      auVar35._0_8_ = local_3d8;
      _y0 = (stbtt__buf)(auVar35 << 0x40);
      scanline = &b;
      if (0x40 < (int)local_3b4) {
        scanline = (stbtt__buf *)ImGui::MemAlloc((ulong)local_3b4 * 8 + 4);
      }
      iVar69 = (int)local_360;
      local_3c0 = (long)(int)uVar70;
      local_430 = (float *)((long)&scanline->data + local_3c0 * 4);
      p_00[iVar87].y0 = (float)((int)local_358 + iVar69) + 1.0;
      local_348 = CONCAT44(local_348._4_4_,(float)(int)y0_2);
      local_280 = local_3c0 * 4;
      local_288 = (long)(iVar67 + 2) << 2;
      local_3c8 = CONCAT44(local_3c8._4_4_,(float)(int)uVar70);
      uVar82 = 0;
      if (0 < (int)uVar70) {
        uVar82 = uVar70;
      }
      local_340 = CONCAT44(local_340._4_4_,uVar82);
      local_290 = 0;
      if (0 < local_3c0) {
        local_290 = local_3c0;
      }
      local_3f0 = 0;
      local_360 = local_360 & 0xffffffff;
      if (iVar69 < 1) {
        local_360 = 0;
      }
      piVar84 = (int *)0x0;
      local_3b0 = local_3b0 & 0xffffffff00000000;
      local_3e8 = (undefined8 *)0x0;
      iVar67 = 0;
      uVar68 = local_358;
      local_2a0 = p_00;
      while (psVar53 = local_2a0, puVar54 = local_3e8, iVar67 != (int)local_360) {
        _y0_2 = CONCAT44(uStack_484,(float)(int)uVar68);
        fVar94 = (float)(int)uVar68 + 1.0;
        local_358 = uVar68;
        local_330 = iVar67;
        memset(scanline,0,local_280);
        memset(local_430,0,local_288);
        piVar55 = &y0;
        while (piVar61 = piVar55, piVar12 = *(int **)piVar61, fVar112 = y0_2, piVar12 != (int *)0x0)
        {
          piVar55 = piVar12;
          if ((float)piVar12[7] <= y0_2) {
            *(undefined8 *)piVar61 = *(undefined8 *)piVar12;
            if (((float)piVar12[5] == 0.0) && (!NAN((float)piVar12[5]))) {
              __assert_fail("z->direction",
                            "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/stb_truetype.h"
                            ,0xc4f,
                            "void stbtt__rasterize_sorted_edges(stbtt__bitmap *, stbtt__edge *, int, int, int, int, void *)"
                           );
            }
            piVar12[5] = 0;
            *(int **)piVar12 = piVar84;
            piVar55 = piVar61;
            piVar84 = piVar12;
          }
        }
        for (; fVar102 = p_00->y0, fVar102 <= fVar94; p_00 = p_00 + 1) {
          fVar95 = p_00->y1;
          if ((fVar102 != fVar95) || (piVar55 = piVar84, NAN(fVar102) || NAN(fVar95))) {
            if (piVar84 == (int *)0x0) {
              if ((int)local_3b0 == 0) {
                puVar54 = (undefined8 *)ImGui::MemAlloc(0x6408);
                if (puVar54 == (undefined8 *)0x0) {
                  __assert_fail("z != __null",
                                "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/stb_truetype.h"
                                ,0xabf,
                                "stbtt__active_edge *stbtt__new_active(stbtt__hheap *, stbtt__edge *, int, float, void *)"
                               );
                }
                *puVar54 = local_3e8;
                fVar102 = p_00->y0;
                fVar95 = p_00->y1;
                iVar67 = 799;
                fVar112 = y0_2;
              }
              else {
                iVar67 = (int)local_3b0 + -1;
                puVar54 = local_3e8;
              }
              local_3b0 = CONCAT44(local_3b0._4_4_,iVar67);
              piVar84 = (int *)(puVar54 + (long)iVar67 * 4 + 1);
              piVar55 = (int *)0x0;
              local_3e8 = puVar54;
            }
            else {
              piVar55 = *(int **)piVar84;
            }
            fVar106 = p_00->x0;
            fVar115 = (p_00->x1 - fVar106) / (fVar95 - fVar102);
            piVar84[3] = (int)fVar115;
            piVar84[4] = -(uint)(fVar115 != 0.0) & (uint)(1.0 / fVar115);
            piVar84[2] = (int)(((fVar112 - fVar102) * fVar115 + fVar106) - (float)local_348);
            piVar84[5] = *(int *)(&DAT_001ae990 + (ulong)(p_00->invert == 0) * 4);
            piVar84[6] = (int)fVar102;
            piVar84[7] = (int)fVar95;
            piVar84[0] = 0;
            piVar84[1] = 0;
            if (fVar95 < fVar112) {
              __assert_fail("z->ey >= scan_y_top",
                            "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/stb_truetype.h"
                            ,0xc5c,
                            "void stbtt__rasterize_sorted_edges(stbtt__bitmap *, stbtt__edge *, int, int, int, int, void *)"
                           );
            }
            *(stbtt__active_edge **)piVar84 = _y0;
            _y0 = (stbtt__active_edge *)piVar84;
          }
          piVar84 = piVar55;
        }
        e = _y0;
        if (_y0 != (stbtt__active_edge *)0x0) {
          for (; e != (stbtt__active_edge *)0x0; e = e->next) {
            fVar102 = e->ey;
            if (fVar102 < fVar112) {
              __assert_fail("e->ey >= y_top",
                            "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/stb_truetype.h"
                            ,0xb93,
                            "void stbtt__fill_active_edges_new(float *, float *, int, stbtt__active_edge *, float)"
                           );
            }
            fVar95 = e->fx;
            fVar106 = e->fdx;
            if ((fVar106 != 0.0) || (NAN(fVar106))) {
              fVar115 = e->sy;
              if (fVar94 < fVar115) {
                __assert_fail("e->sy <= y_bottom && e->ey >= y_top",
                              "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/stb_truetype.h"
                              ,0xba6,
                              "void stbtt__fill_active_edges_new(float *, float *, int, stbtt__active_edge *, float)"
                             );
              }
              fVar111 = fVar106 + fVar95;
              fVar110 = (float)(~-(uint)(fVar112 < fVar115) & (uint)fVar95 |
                               (uint)((fVar115 - fVar112) * fVar106 + fVar95) &
                               -(uint)(fVar112 < fVar115));
              if ((((fVar110 < 0.0) ||
                   (fVar108 = (float)(~-(uint)(fVar102 < fVar94) & (uint)fVar111 |
                                     (uint)((fVar102 - fVar112) * fVar106 + fVar95) &
                                     -(uint)(fVar102 < fVar94)), fVar108 < 0.0)) ||
                  ((float)local_3c8 <= fVar110)) || ((float)local_3c8 <= fVar108)) {
                local_328 = ZEXT416((uint)fVar95);
                local_428 = ZEXT416((uint)fVar111);
                uVar113 = 0;
                uVar114 = 0;
                local_3fc = fVar106;
                iVar67 = 0;
                while ((int)local_340 != iVar67) {
                  fVar106 = (float)iVar67;
                  fVar102 = (float)(iVar67 + 1);
                  fVar110 = (fVar106 - fVar95) / local_3fc + fVar112;
                  fVar115 = (fVar102 - fVar95) / local_3fc + fVar112;
                  local_448 = CONCAT44(local_448._4_4_,fVar106);
                  if ((fVar106 <= fVar95) || (fVar111 <= fVar102)) {
                    if ((fVar106 <= fVar111) || (fVar95 <= fVar102)) {
                      if (((fVar106 <= fVar95) || (fVar111 <= fVar106)) &&
                         ((fVar106 <= fVar111 || (fVar95 <= fVar106)))) {
                        if (((fVar95 < fVar102) && (fVar102 < fVar111)) ||
                           ((fVar111 < fVar102 && (fVar102 < fVar95)))) {
                          local_478._0_4_ = fVar102;
                          local_458._0_4_ = fVar115;
                          goto LAB_00176e4a;
                        }
                        auVar105._4_4_ = 0;
                        auVar105._0_4_ = fVar111;
                        auVar105._8_4_ = uVar113;
                        auVar105._12_4_ = uVar114;
                        fVar110 = fVar112;
                        goto LAB_00176ef9;
                      }
                    }
                    else {
                      local_478._0_4_ = fVar102;
                      local_458._0_4_ = fVar115;
                      stbtt__handle_clipped_edge
                                ((float *)scanline,iVar67,e,fVar95,fVar112,fVar102,fVar115);
                      fVar95 = (float)local_478._0_4_;
                      fVar106 = (float)local_448;
                      fVar112 = (float)local_458._0_4_;
                    }
                    stbtt__handle_clipped_edge
                              ((float *)scanline,iVar67,e,fVar95,fVar112,fVar106,fVar110);
                    auVar105 = local_428;
                    fVar95 = (float)local_448;
                  }
                  else {
                    local_478._0_4_ = fVar102;
                    local_458._0_4_ = fVar115;
                    stbtt__handle_clipped_edge
                              ((float *)scanline,iVar67,e,fVar95,fVar112,fVar106,fVar110);
                    fVar95 = (float)local_448;
                    fVar102 = (float)local_478._0_4_;
                    fVar115 = (float)local_458._0_4_;
                    fVar112 = fVar110;
LAB_00176e4a:
                    stbtt__handle_clipped_edge
                              ((float *)scanline,iVar67,e,fVar95,fVar112,fVar102,fVar115);
                    auVar105 = local_428;
                    fVar95 = (float)local_478._0_4_;
                    fVar110 = (float)local_458._0_4_;
                  }
LAB_00176ef9:
                  stbtt__handle_clipped_edge
                            ((float *)scanline,iVar67,e,fVar95,fVar110,auVar105._0_4_,fVar94);
                  fVar95 = (float)local_328._0_4_;
                  fVar111 = (float)local_428._0_4_;
                  uVar113 = local_428._8_4_;
                  uVar114 = local_428._12_4_;
                  iVar67 = iVar67 + 1;
                  fVar112 = y0_2;
                }
              }
              else {
                if (fVar115 <= fVar112) {
                  fVar115 = fVar112;
                }
                uVar70 = (uint)fVar110;
                if (fVar94 <= fVar102) {
                  fVar102 = fVar94;
                }
                uVar82 = (uint)fVar108;
                if (uVar70 == uVar82) {
                  if (((int)uVar70 < 0) || ((int)local_3b4 <= (int)uVar70)) {
                    __assert_fail("x >= 0 && x < len",
                                  "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/stb_truetype.h"
                                  ,0xbc2,
                                  "void stbtt__fill_active_edges_new(float *, float *, int, stbtt__active_edge *, float)"
                                 );
                  }
                  uVar68 = (ulong)uVar70;
                  *(float *)((long)&scanline->data + uVar68 * 4) =
                       (((fVar108 - (float)(int)uVar70) + (fVar110 - (float)(int)uVar70)) * -0.5 +
                       1.0) * e->direction * (fVar102 - fVar115) +
                       *(float *)((long)&scanline->data + uVar68 * 4);
                  fVar95 = (fVar102 - fVar115) * e->direction;
                }
                else {
                  fVar106 = e->fdy;
                  uVar85 = uVar70;
                  fVar107 = fVar110;
                  if (fVar108 < fVar110) {
                    fVar107 = fVar112 - fVar115;
                    fVar115 = (fVar112 - fVar102) + fVar94;
                    fVar106 = -fVar106;
                    fVar95 = fVar111;
                    uVar85 = uVar82;
                    uVar82 = uVar70;
                    fVar102 = fVar107 + fVar94;
                    fVar107 = fVar108;
                    fVar108 = fVar110;
                  }
                  iVar67 = uVar85 + 1;
                  fVar111 = ((float)iVar67 - fVar95) * fVar106 + fVar112;
                  fVar95 = e->direction;
                  fVar110 = (fVar111 - fVar115) * fVar95;
                  *(float *)((long)&scanline->data + (long)(int)uVar85 * 4) =
                       (1.0 - ((fVar107 - (float)(int)uVar85) + 1.0) * 0.5) * fVar110 +
                       *(float *)((long)&scanline->data + (long)(int)uVar85 * 4);
                  uVar68 = (ulong)(int)uVar82;
                  for (lVar88 = (long)iVar67; lVar88 < (long)uVar68; lVar88 = lVar88 + 1) {
                    *(float *)((long)&scanline->data + lVar88 * 4) =
                         fVar106 * fVar95 * 0.5 + fVar110 +
                         *(float *)((long)&scanline->data + lVar88 * 4);
                    fVar110 = fVar110 + fVar106 * fVar95;
                  }
                  if (1.01 < ABS(fVar110)) {
                    __assert_fail("ImFabs(area) <= 1.01f",
                                  "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/stb_truetype.h"
                                  ,0xbe7,
                                  "void stbtt__fill_active_edges_new(float *, float *, int, stbtt__active_edge *, float)"
                                 );
                  }
                  *(float *)((long)&scanline->data + uVar68 * 4) =
                       (fVar102 - (fVar106 * (float)(int)(uVar82 - iVar67) + fVar111)) *
                       (((fVar108 - (float)(int)uVar82) + 0.0) * -0.5 + 1.0) * fVar95 + fVar110 +
                       *(float *)((long)&scanline->data + uVar68 * 4);
                  fVar95 = (fVar102 - fVar115) * fVar95;
                }
                local_430[uVar68 + 1] = fVar95 + local_430[uVar68 + 1];
              }
            }
            else if (fVar95 < (float)local_3c8) {
              if (0.0 <= fVar95) {
                local_328 = ZEXT416((uint)fVar95);
                stbtt__handle_clipped_edge
                          ((float *)scanline,(int)fVar95,e,fVar95,fVar112,fVar95,fVar94);
                iVar67 = (int)fVar95 + 1;
                auVar99 = local_328;
                fVar112 = y0_2;
              }
              else {
                iVar67 = 0;
                auVar99 = ZEXT416((uint)fVar95);
              }
              stbtt__handle_clipped_edge
                        (local_430,iVar67,e,auVar99._0_4_,fVar112,auVar99._0_4_,fVar94);
              fVar112 = y0_2;
            }
          }
        }
        fVar94 = 0.0;
        lVar88 = local_290;
        psVar62 = scanline;
        uVar68 = local_3f0;
        while (bVar92 = lVar88 != 0, lVar88 = lVar88 + -1, bVar92) {
          fVar94 = fVar94 + *(float *)((long)&psVar62->data + local_3c0 * 4);
          iVar67 = (int)(ABS(*(float *)&psVar62->data + fVar94) * 255.0 + 0.5);
          if (0xfe < iVar67) {
            iVar67 = 0xff;
          }
          local_3a8[(int)uVar68] = (uchar)iVar67;
          uVar68 = (ulong)((int)uVar68 + 1);
          psVar62 = (stbtt__buf *)((long)&psVar62->data + 4);
        }
        plVar56 = (long *)&y0;
        while (plVar56 = (long *)*plVar56, plVar56 != (long *)0x0) {
          *(float *)(plVar56 + 1) = *(float *)((long)plVar56 + 0xc) + *(float *)(plVar56 + 1);
        }
        uVar68 = (ulong)((int)local_358 + 1);
        local_3f0 = (ulong)(uint)((int)local_3f0 + (int)local_2e0);
        iVar67 = local_330 + 1;
      }
      while (puVar54 != (undefined8 *)0x0) {
        puVar13 = (undefined8 *)*puVar54;
        ImGui::MemFree(puVar54);
        puVar54 = puVar13;
      }
      if (scanline != &b) {
        ImGui::MemFree(scanline);
      }
      ImGui::MemFree(psVar53);
    }
    ImGui::MemFree(local_468);
    psVar52 = local_368;
LAB_00177256:
    ImGui::MemFree(psVar52);
  }
LAB_0017725b:
  ImGui::MemFree((void *)CONCAT44(uStack_404,cstype));
  uVar85 = local_3a0.h_oversample;
  uVar78 = local_3a0._32_8_ & 0xffffffff;
  uVar70 = *(uint *)(local_350 + 8);
  uVar82 = *(uint *)(local_350 + 4);
  if (1 < uVar78) {
    local_448 = (long)local_3a0.stride_in_bytes;
    lVar88 = (long)(int)((uVar70 >> 0x10) * local_3a0.stride_in_bytes);
    puVar51 = local_3a0.pixels + lVar88 + (ulong)(ushort)uVar70;
    iVar67 = (uVar82 & 0xffff) - local_3a0.h_oversample;
    b.data._0_4_ = 0;
    b.data._4_4_ = 0;
    if (iVar67 < 0) {
      iVar67 = -1;
    }
    uVar68 = (long)iVar67 + 1;
    puVar73 = local_3a0.pixels + lVar88 + (ulong)(ushort)uVar70 + (long)iVar67 + 1;
    for (uVar70 = 0; uVar70 != uVar82 >> 0x10; uVar70 = uVar70 + 1) {
      memset(&b,0,uVar78);
      puVar76 = puVar73;
      uVar89 = uVar68;
      switch(uVar85) {
      case 2:
        uVar63 = 0;
        for (uVar75 = 0; uVar68 != uVar75; uVar75 = uVar75 + 1) {
          bVar93 = puVar51[uVar75];
          bVar9 = *(byte *)((long)&b.data + (ulong)((uint)uVar75 & 7));
          *(byte *)((long)&b.data + (ulong)((uint)uVar75 + 2 & 7)) = bVar93;
          uVar59 = (int)uVar63 + ((uint)bVar93 - (uint)bVar9);
          uVar63 = (ulong)uVar59;
          puVar51[uVar75] = (uchar)(uVar59 >> 1);
        }
        break;
      case 3:
        uVar63 = 0;
        for (uVar75 = 0; uVar68 != uVar75; uVar75 = uVar75 + 1) {
          bVar93 = puVar51[uVar75];
          bVar9 = *(byte *)((long)&b.data + (ulong)((uint)uVar75 & 7));
          *(byte *)((long)&b.data + (ulong)((uint)uVar75 + 3 & 7)) = bVar93;
          uVar63 = (ulong)((int)uVar63 + ((uint)bVar93 - (uint)bVar9));
          puVar51[uVar75] = (uchar)(uVar63 / 3);
        }
        break;
      case 4:
        uVar63 = 0;
        for (uVar75 = 0; uVar68 != uVar75; uVar75 = uVar75 + 1) {
          bVar93 = puVar51[uVar75];
          uVar77 = (ulong)((uint)uVar75 & 7);
          bVar9 = *(byte *)((long)&b.data + uVar77);
          *(byte *)((long)&b.data + (uVar77 ^ 4)) = bVar93;
          uVar59 = (int)uVar63 + ((uint)bVar93 - (uint)bVar9);
          uVar63 = (ulong)uVar59;
          puVar51[uVar75] = (uchar)(uVar59 >> 2);
        }
        break;
      case 5:
        uVar63 = 0;
        for (uVar75 = 0; uVar68 != uVar75; uVar75 = uVar75 + 1) {
          bVar93 = puVar51[uVar75];
          bVar9 = *(byte *)((long)&b.data + (ulong)((uint)uVar75 & 7));
          *(byte *)((long)&b.data + (ulong)((uint)uVar75 + 5 & 7)) = bVar93;
          uVar63 = (ulong)((int)uVar63 + ((uint)bVar93 - (uint)bVar9));
          puVar51[uVar75] = (uchar)(uVar63 / 5);
        }
        break;
      default:
        uVar63 = 0;
        for (uVar75 = 0; uVar68 != uVar75; uVar75 = uVar75 + 1) {
          bVar93 = puVar51[uVar75];
          bVar9 = *(byte *)((long)&b.data + (ulong)((uint)uVar75 & 7));
          *(byte *)((long)&b.data + (ulong)(uVar85 + (uint)uVar75 & 7)) = bVar93;
          uVar59 = (int)uVar63 + ((uint)bVar93 - (uint)bVar9);
          uVar63 = (ulong)uVar59;
          puVar51[uVar75] = (uchar)(uVar59 / uVar85);
        }
      }
      for (; uVar89 < (uVar82 & 0xffff); uVar89 = uVar89 + 1) {
        if (*puVar76 != '\0') {
          __assert_fail("pixels[i] == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/stb_truetype.h"
                        ,0xf21,
                        "void stbtt__h_prefilter(unsigned char *, int, int, int, unsigned int)");
        }
        uVar59 = (int)uVar63 - (uint)*(byte *)((long)&b.data + (ulong)((uint)uVar89 & 7));
        uVar63 = (ulong)uVar59;
        *puVar76 = (uchar)(uVar59 / uVar85);
        puVar76 = puVar76 + 1;
      }
      puVar51 = puVar51 + local_448;
      puVar73 = puVar73 + local_448;
    }
    uVar70 = *(uint *)(local_350 + 8);
    uVar82 = *(uint *)(local_350 + 4);
  }
  uVar85 = local_3a0.v_oversample;
  uVar68 = (ulong)local_3a0.v_oversample;
  if (1 < uVar68) {
    lVar48 = (long)local_3a0.stride_in_bytes;
    lVar88 = (long)(int)((uVar70 >> 0x10) * local_3a0.stride_in_bytes);
    pbVar86 = local_3a0.pixels + lVar88 + (ulong)(ushort)uVar70;
    local_478._0_4_ = uVar82 & 0xffff;
    uVar58 = (ushort)(uVar82 >> 0x10);
    b.data._0_4_ = 0;
    b.data._4_4_ = 0;
    iVar67 = uVar58 - local_3a0.v_oversample;
    if (iVar67 < 0) {
      iVar67 = -1;
    }
    uVar89 = (long)iVar67 + 1;
    puVar51 = local_3a0.pixels + uVar89 * lVar48 + lVar88 + (ulong)(ushort)uVar70;
    iVar67 = 0;
    while (iVar67 != local_478._0_4_) {
      local_448 = CONCAT44(local_448._4_4_,iVar67);
      memset(&b,0,uVar68);
      puVar73 = puVar51;
      uVar63 = uVar89;
      switch(uVar85) {
      case 2:
        uVar75 = 0;
        pbVar80 = pbVar86;
        for (uVar77 = 0; uVar89 != uVar77; uVar77 = uVar77 + 1) {
          bVar93 = *pbVar80;
          bVar9 = *(byte *)((long)&b.data + (ulong)((uint)uVar77 & 7));
          *(byte *)((long)&b.data + (ulong)((uint)uVar77 + 2 & 7)) = bVar93;
          uVar70 = (int)uVar75 + ((uint)bVar93 - (uint)bVar9);
          uVar75 = (ulong)uVar70;
          *pbVar80 = (byte)(uVar70 >> 1);
          pbVar80 = pbVar80 + lVar48;
        }
        break;
      case 3:
        uVar75 = 0;
        pbVar80 = pbVar86;
        for (uVar77 = 0; uVar89 != uVar77; uVar77 = uVar77 + 1) {
          bVar93 = *pbVar80;
          bVar9 = *(byte *)((long)&b.data + (ulong)((uint)uVar77 & 7));
          *(byte *)((long)&b.data + (ulong)((uint)uVar77 + 3 & 7)) = bVar93;
          uVar75 = (ulong)((int)uVar75 + ((uint)bVar93 - (uint)bVar9));
          *pbVar80 = (byte)(uVar75 / 3);
          pbVar80 = pbVar80 + lVar48;
        }
        break;
      case 4:
        uVar75 = 0;
        pbVar80 = pbVar86;
        for (uVar77 = 0; uVar89 != uVar77; uVar77 = uVar77 + 1) {
          bVar93 = *pbVar80;
          uVar79 = (ulong)((uint)uVar77 & 7);
          bVar9 = *(byte *)((long)&b.data + uVar79);
          *(byte *)((long)&b.data + (uVar79 ^ 4)) = bVar93;
          uVar70 = (int)uVar75 + ((uint)bVar93 - (uint)bVar9);
          uVar75 = (ulong)uVar70;
          *pbVar80 = (byte)(uVar70 >> 2);
          pbVar80 = pbVar80 + lVar48;
        }
        break;
      case 5:
        uVar75 = 0;
        pbVar80 = pbVar86;
        for (uVar77 = 0; uVar89 != uVar77; uVar77 = uVar77 + 1) {
          bVar93 = *pbVar80;
          bVar9 = *(byte *)((long)&b.data + (ulong)((uint)uVar77 & 7));
          *(byte *)((long)&b.data + (ulong)((uint)uVar77 + 5 & 7)) = bVar93;
          uVar75 = (ulong)((int)uVar75 + ((uint)bVar93 - (uint)bVar9));
          *pbVar80 = (byte)(uVar75 / 5);
          pbVar80 = pbVar80 + lVar48;
        }
        break;
      default:
        uVar75 = 0;
        pbVar80 = pbVar86;
        for (uVar77 = 0; uVar89 != uVar77; uVar77 = uVar77 + 1) {
          bVar93 = *pbVar80;
          bVar9 = *(byte *)((long)&b.data + (ulong)((uint)uVar77 & 7));
          *(byte *)((long)&b.data + (ulong)(uVar85 + (uint)uVar77 & 7)) = bVar93;
          uVar70 = (int)uVar75 + ((uint)bVar93 - (uint)bVar9);
          uVar75 = (ulong)uVar70;
          *pbVar80 = (byte)(uVar70 / uVar85);
          pbVar80 = pbVar80 + lVar48;
        }
      }
      for (; uVar63 < uVar58; uVar63 = uVar63 + 1) {
        if (*puVar73 != '\0') {
          __assert_fail("pixels[i*stride_in_bytes] == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/stb_truetype.h"
                        ,0xf5f,
                        "void stbtt__v_prefilter(unsigned char *, int, int, int, unsigned int)");
        }
        uVar70 = (int)uVar75 - (uint)*(byte *)((long)&b.data + (ulong)((uint)uVar63 & 7));
        uVar75 = (ulong)uVar70;
        *puVar73 = (uchar)(uVar70 / uVar85);
        puVar73 = puVar73 + lVar48;
      }
      pbVar86 = pbVar86 + 1;
      puVar51 = puVar51 + 1;
      iVar67 = (int)(float)local_448 + 1;
    }
    uVar70 = *(uint *)(local_350 + 8);
    uVar82 = *(uint *)(local_350 + 4);
  }
  *local_278 = uVar70;
  uVar58 = (ushort)(uVar82 >> 0x10);
  local_278[1] = CONCAT22((short)(uVar70 >> 0x10) + uVar58,(short)uVar70 + (short)uVar82);
  local_278[4] = (uint)((float)(int)(short)((short)(local_334 << 8) + (short)local_338) * local_2d8)
  ;
  *(ulong *)(local_278 + 2) =
       CONCAT44((float)y0_1 * local_258._4_4_ + local_248._4_4_,
                (float)x0_1 * local_258._0_4_ + local_248._0_4_);
  local_278[5] = (uint)((float)(int)((uVar82 & 0xffff) + x0_1) * local_258._0_4_ + local_248._0_4_);
  local_278[6] = (uint)((float)(int)((uint)uVar58 + y0_1) * local_258._4_4_ + local_248._4_4_);
  lVar64 = local_2f0;
  lVar48 = local_308;
  lVar83 = local_2f8;
  lVar88 = local_2e8;
  auVar99 = local_248;
LAB_001777d2:
  lVar88 = lVar88 + 1;
  lVar64 = lVar64 + 1;
  goto LAB_001762a7;
}

Assistant:

bool    ImFontAtlasBuildWithStbTruetype(ImFontAtlas* atlas)
{
    IM_ASSERT(atlas->ConfigData.Size > 0);

    ImFontAtlasBuildRegisterDefaultCustomRects(atlas);

    atlas->TexID = NULL;
    atlas->TexWidth = atlas->TexHeight = 0;
    atlas->TexUvScale = ImVec2(0.0f, 0.0f);
    atlas->TexUvWhitePixel = ImVec2(0.0f, 0.0f);
    atlas->ClearTexData();

    // Count glyphs/ranges
    int total_glyphs_count = 0;
    int total_ranges_count = 0;
    for (int input_i = 0; input_i < atlas->ConfigData.Size; input_i++)
    {
        ImFontConfig& cfg = atlas->ConfigData[input_i];
        if (!cfg.GlyphRanges)
            cfg.GlyphRanges = atlas->GetGlyphRangesDefault();
        for (const ImWchar* in_range = cfg.GlyphRanges; in_range[0] && in_range[1]; in_range += 2, total_ranges_count++)
            total_glyphs_count += (in_range[1] - in_range[0]) + 1;
    }

    // We need a width for the skyline algorithm. Using a dumb heuristic here to decide of width. User can override TexDesiredWidth and TexGlyphPadding if they wish.
    // Width doesn't really matter much, but some API/GPU have texture size limitations and increasing width can decrease height.
    atlas->TexWidth = (atlas->TexDesiredWidth > 0) ? atlas->TexDesiredWidth : (total_glyphs_count > 4000) ? 4096 : (total_glyphs_count > 2000) ? 2048 : (total_glyphs_count > 1000) ? 1024 : 512;
    atlas->TexHeight = 0;

    // Start packing
    const int max_tex_height = 1024*32;
    stbtt_pack_context spc = {};
    if (!stbtt_PackBegin(&spc, NULL, atlas->TexWidth, max_tex_height, 0, atlas->TexGlyphPadding, NULL))
        return false;
    stbtt_PackSetOversampling(&spc, 1, 1);

    // Pack our extra data rectangles first, so it will be on the upper-left corner of our texture (UV will have small values).
    ImFontAtlasBuildPackCustomRects(atlas, spc.pack_info);

    // Initialize font information (so we can error without any cleanup)
    struct ImFontTempBuildData
    {
        stbtt_fontinfo      FontInfo;
        stbrp_rect*         Rects;
        int                 RectsCount;
        stbtt_pack_range*   Ranges;
        int                 RangesCount;
    };
    ImFontTempBuildData* tmp_array = (ImFontTempBuildData*)ImGui::MemAlloc((size_t)atlas->ConfigData.Size * sizeof(ImFontTempBuildData));
    for (int input_i = 0; input_i < atlas->ConfigData.Size; input_i++)
    {
        ImFontConfig& cfg = atlas->ConfigData[input_i];
        ImFontTempBuildData& tmp = tmp_array[input_i];
        IM_ASSERT(cfg.DstFont && (!cfg.DstFont->IsLoaded() || cfg.DstFont->ContainerAtlas == atlas));

        const int font_offset = stbtt_GetFontOffsetForIndex((unsigned char*)cfg.FontData, cfg.FontNo);
        IM_ASSERT(font_offset >= 0 && "FontData is incorrect, or FontNo cannot be found.");
        if (!stbtt_InitFont(&tmp.FontInfo, (unsigned char*)cfg.FontData, font_offset))
        {
            atlas->TexWidth = atlas->TexHeight = 0; // Reset output on failure
            ImGui::MemFree(tmp_array);
            return false;
        }
    }

    // Allocate packing character data and flag packed characters buffer as non-packed (x0=y0=x1=y1=0)
    int buf_packedchars_n = 0, buf_rects_n = 0, buf_ranges_n = 0;
    stbtt_packedchar* buf_packedchars = (stbtt_packedchar*)ImGui::MemAlloc(total_glyphs_count * sizeof(stbtt_packedchar));
    stbrp_rect* buf_rects = (stbrp_rect*)ImGui::MemAlloc(total_glyphs_count * sizeof(stbrp_rect));
    stbtt_pack_range* buf_ranges = (stbtt_pack_range*)ImGui::MemAlloc(total_ranges_count * sizeof(stbtt_pack_range));
    memset(buf_packedchars, 0, total_glyphs_count * sizeof(stbtt_packedchar));
    memset(buf_rects, 0, total_glyphs_count * sizeof(stbrp_rect));              // Unnecessary but let's clear this for the sake of sanity.
    memset(buf_ranges, 0, total_ranges_count * sizeof(stbtt_pack_range));

    // First font pass: pack all glyphs (no rendering at this point, we are working with rectangles in an infinitely tall texture at this point)
    for (int input_i = 0; input_i < atlas->ConfigData.Size; input_i++)
    {
        ImFontConfig& cfg = atlas->ConfigData[input_i];
        ImFontTempBuildData& tmp = tmp_array[input_i];

        // Setup ranges
        int font_glyphs_count = 0;
        int font_ranges_count = 0;
        for (const ImWchar* in_range = cfg.GlyphRanges; in_range[0] && in_range[1]; in_range += 2, font_ranges_count++)
            font_glyphs_count += (in_range[1] - in_range[0]) + 1;
        tmp.Ranges = buf_ranges + buf_ranges_n;
        tmp.RangesCount = font_ranges_count;
        buf_ranges_n += font_ranges_count;
        for (int i = 0; i < font_ranges_count; i++)
        {
            const ImWchar* in_range = &cfg.GlyphRanges[i * 2];
            stbtt_pack_range& range = tmp.Ranges[i];
            range.font_size = cfg.SizePixels;
            range.first_unicode_codepoint_in_range = in_range[0];
            range.num_chars = (in_range[1] - in_range[0]) + 1;
            range.chardata_for_range = buf_packedchars + buf_packedchars_n;
            buf_packedchars_n += range.num_chars;
        }

        // Gather the sizes of all rectangle we need
        tmp.Rects = buf_rects + buf_rects_n;
        tmp.RectsCount = font_glyphs_count;
        buf_rects_n += font_glyphs_count;
        stbtt_PackSetOversampling(&spc, cfg.OversampleH, cfg.OversampleV);
        int n = stbtt_PackFontRangesGatherRects(&spc, &tmp.FontInfo, tmp.Ranges, tmp.RangesCount, tmp.Rects);
        IM_ASSERT(n == font_glyphs_count);

        // Detect missing glyphs and replace them with a zero-sized box instead of relying on the default glyphs
        // This allows us merging overlapping icon fonts more easily.
        int rect_i = 0;
        for (int range_i = 0; range_i < tmp.RangesCount; range_i++)
            for (int char_i = 0; char_i < tmp.Ranges[range_i].num_chars; char_i++, rect_i++)
                if (stbtt_FindGlyphIndex(&tmp.FontInfo, tmp.Ranges[range_i].first_unicode_codepoint_in_range + char_i) == 0)
                    tmp.Rects[rect_i].w = tmp.Rects[rect_i].h = 0;

        // Pack
        stbrp_pack_rects((stbrp_context*)spc.pack_info, tmp.Rects, n);

        // Extend texture height
        // Also mark missing glyphs as non-packed so we don't attempt to render into them
        for (int i = 0; i < n; i++)
        {
            if (tmp.Rects[i].w == 0 && tmp.Rects[i].h == 0)
                tmp.Rects[i].was_packed = 0;
            if (tmp.Rects[i].was_packed)
                atlas->TexHeight = ImMax(atlas->TexHeight, tmp.Rects[i].y + tmp.Rects[i].h);
        }
    }
    IM_ASSERT(buf_rects_n == total_glyphs_count);
    IM_ASSERT(buf_packedchars_n == total_glyphs_count);
    IM_ASSERT(buf_ranges_n == total_ranges_count);

    // Create texture
    atlas->TexHeight = (atlas->Flags & ImFontAtlasFlags_NoPowerOfTwoHeight) ? (atlas->TexHeight + 1) : ImUpperPowerOfTwo(atlas->TexHeight);
    atlas->TexUvScale = ImVec2(1.0f / atlas->TexWidth, 1.0f / atlas->TexHeight);
    atlas->TexPixelsAlpha8 = (unsigned char*)ImGui::MemAlloc(atlas->TexWidth * atlas->TexHeight);
    memset(atlas->TexPixelsAlpha8, 0, atlas->TexWidth * atlas->TexHeight);
    spc.pixels = atlas->TexPixelsAlpha8;
    spc.height = atlas->TexHeight;

    // Second pass: render font characters
    for (int input_i = 0; input_i < atlas->ConfigData.Size; input_i++)
    {
        ImFontConfig& cfg = atlas->ConfigData[input_i];
        ImFontTempBuildData& tmp = tmp_array[input_i];
        stbtt_PackSetOversampling(&spc, cfg.OversampleH, cfg.OversampleV);
        stbtt_PackFontRangesRenderIntoRects(&spc, &tmp.FontInfo, tmp.Ranges, tmp.RangesCount, tmp.Rects);
        if (cfg.RasterizerMultiply != 1.0f)
        {
            unsigned char multiply_table[256];
            ImFontAtlasBuildMultiplyCalcLookupTable(multiply_table, cfg.RasterizerMultiply);
            for (const stbrp_rect* r = tmp.Rects; r != tmp.Rects + tmp.RectsCount; r++)
                if (r->was_packed)
                    ImFontAtlasBuildMultiplyRectAlpha8(multiply_table, spc.pixels, r->x, r->y, r->w, r->h, spc.stride_in_bytes);
        }
        tmp.Rects = NULL;
    }

    // End packing
    stbtt_PackEnd(&spc);
    ImGui::MemFree(buf_rects);
    buf_rects = NULL;

    // Third pass: setup ImFont and glyphs for runtime
    for (int input_i = 0; input_i < atlas->ConfigData.Size; input_i++)
    {
        ImFontConfig& cfg = atlas->ConfigData[input_i];
        ImFontTempBuildData& tmp = tmp_array[input_i];
        ImFont* dst_font = cfg.DstFont; // We can have multiple input fonts writing into a same destination font (when using MergeMode=true)
        if (cfg.MergeMode)
            dst_font->BuildLookupTable();

        const float font_scale = stbtt_ScaleForPixelHeight(&tmp.FontInfo, cfg.SizePixels);
        int unscaled_ascent, unscaled_descent, unscaled_line_gap;
        stbtt_GetFontVMetrics(&tmp.FontInfo, &unscaled_ascent, &unscaled_descent, &unscaled_line_gap);

        const float ascent = ImFloor(unscaled_ascent * font_scale + ((unscaled_ascent > 0.0f) ? +1 : -1));
        const float descent = ImFloor(unscaled_descent * font_scale + ((unscaled_descent > 0.0f) ? +1 : -1));
        ImFontAtlasBuildSetupFont(atlas, dst_font, &cfg, ascent, descent);
        const float off_x = cfg.GlyphOffset.x;
        const float off_y = cfg.GlyphOffset.y + (float)(int)(dst_font->Ascent + 0.5f);

        for (int i = 0; i < tmp.RangesCount; i++)
        {
            stbtt_pack_range& range = tmp.Ranges[i];
            for (int char_idx = 0; char_idx < range.num_chars; char_idx += 1)
            {
                const stbtt_packedchar& pc = range.chardata_for_range[char_idx];
                if (!pc.x0 && !pc.x1 && !pc.y0 && !pc.y1)
                    continue;

                const int codepoint = range.first_unicode_codepoint_in_range + char_idx;
                if (cfg.MergeMode && dst_font->FindGlyphNoFallback((unsigned short)codepoint))
                    continue;

                stbtt_aligned_quad q;
                float dummy_x = 0.0f, dummy_y = 0.0f;
                stbtt_GetPackedQuad(range.chardata_for_range, atlas->TexWidth, atlas->TexHeight, char_idx, &dummy_x, &dummy_y, &q, 0);
                dst_font->AddGlyph((ImWchar)codepoint, q.x0 + off_x, q.y0 + off_y, q.x1 + off_x, q.y1 + off_y, q.s0, q.t0, q.s1, q.t1, pc.xadvance);
            }
        }
    }

    // Cleanup temporaries
    ImGui::MemFree(buf_packedchars);
    ImGui::MemFree(buf_ranges);
    ImGui::MemFree(tmp_array);

    ImFontAtlasBuildFinish(atlas);

    return true;
}